

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O2

void __thiscall
Assimp::ColladaLoader::BuildMeshesForNode
          (ColladaLoader *this,ColladaParser *pParser,Node *pNode,aiNode *pTarget)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  pointer pMVar3;
  pointer pSVar4;
  pointer ppaVar5;
  pointer ppaVar6;
  ulong __n;
  pointer puVar7;
  aiMesh *paVar8;
  const_iterator cVar9;
  const_iterator cVar10;
  Logger *pLVar11;
  iterator iVar12;
  iterator iVar13;
  mapped_type_conflict3 *pmVar14;
  const_iterator cVar15;
  uint *puVar16;
  SubMesh *pSubMesh;
  pointer puVar17;
  pointer ppVar18;
  ColladaLoader *this_00;
  long lVar19;
  ulong pSubMesh_00;
  pointer __k;
  SemanticMappingTable *table;
  _Rb_tree_color local_2ac;
  size_t local_2a0;
  Mesh *local_298;
  string meshMaterial;
  Controller *local_258;
  size_t local_250;
  vector<unsigned_long,_std::allocator<unsigned_long>_> newMeshRefs;
  unsigned_long local_1d0;
  aiMesh *dstMesh;
  ColladaMeshIndex index;
  
  newMeshRefs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  newMeshRefs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  newMeshRefs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&newMeshRefs,
             ((long)(pNode->mMeshes).
                    super__Vector_base<Assimp::Collada::MeshInstance,_std::allocator<Assimp::Collada::MeshInstance>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pNode->mMeshes).
                   super__Vector_base<Assimp::Collada::MeshInstance,_std::allocator<Assimp::Collada::MeshInstance>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x50);
  __k = (pNode->mMeshes).
        super__Vector_base<Assimp::Collada::MeshInstance,_std::allocator<Assimp::Collada::MeshInstance>_>
        ._M_impl.super__Vector_impl_data._M_start;
  pMVar3 = (pNode->mMeshes).
           super__Vector_base<Assimp::Collada::MeshInstance,_std::allocator<Assimp::Collada::MeshInstance>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  p_Var1 = &(pParser->mMeshLibrary)._M_t._M_impl.super__Rb_tree_header;
  do {
    puVar7 = newMeshRefs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar17 = newMeshRefs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (__k == pMVar3) {
      pTarget->mNumMeshes =
           (uint)((ulong)((long)newMeshRefs.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)newMeshRefs.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
      if ((long)newMeshRefs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)newMeshRefs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start != 0) {
        puVar16 = (uint *)operator_new__((ulong)((long)newMeshRefs.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)newMeshRefs.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 1 &
                                         0x3fffffffc);
        pTarget->mMeshes = puVar16;
        for (; puVar17 != puVar7; puVar17 = puVar17 + 1) {
          *puVar16 = (uint)*puVar17;
          puVar16 = puVar16 + 1;
        }
      }
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&newMeshRefs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      return;
    }
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Mesh_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Mesh_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Mesh_*>_>_>
            ::find(&(pParser->mMeshLibrary)._M_t,&__k->mMeshOrController);
    if ((_Rb_tree_header *)cVar9._M_node == p_Var1) {
      cVar15 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Controller>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Controller>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Controller>_>_>
               ::find(&(pParser->mControllerLibrary)._M_t,&__k->mMeshOrController);
      if ((_Rb_tree_header *)cVar15._M_node !=
          &(pParser->mControllerLibrary)._M_t._M_impl.super__Rb_tree_header) {
        cVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Mesh_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Mesh_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Mesh_*>_>_>
                ::find(&(pParser->mMeshLibrary)._M_t,(key_type *)&cVar15._M_node[2]._M_parent);
        if (((_Rb_tree_header *)cVar9._M_node != p_Var1) &&
           (local_298 = *(Mesh **)(cVar9._M_node + 2), local_298 != (Mesh *)0x0)) {
          local_258 = (Controller *)(cVar15._M_node + 2);
          goto LAB_003e28de;
        }
      }
      pLVar11 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[42]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&index,
                 (char (*) [42])"Collada: Unable to find geometry for ID \"");
      std::operator<<((ostream *)&index,(string *)__k);
      std::operator<<((ostream *)&index,"\". Skipping.");
      std::__cxx11::stringbuf::str();
      Logger::warn(pLVar11,meshMaterial._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&meshMaterial);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&index);
    }
    else {
      local_298 = *(Mesh **)(cVar9._M_node + 2);
      local_258 = (Controller *)0x0;
LAB_003e28de:
      lVar19 = 0;
      local_250 = 0;
      local_2a0 = 0;
      pSubMesh_00 = 0;
      while( true ) {
        pSVar4 = (local_298->mSubMeshes).
                 super__Vector_base<Assimp::Collada::SubMesh,_std::allocator<Assimp::Collada::SubMesh>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)(((long)(local_298->mSubMeshes).
                           super__Vector_base<Assimp::Collada::SubMesh,_std::allocator<Assimp::Collada::SubMesh>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar4) / 0x28) <=
            pSubMesh_00) break;
        if (*(long *)((long)&pSVar4->mNumFaces + lVar19) != 0) {
          pSubMesh = (SubMesh *)((long)&(pSVar4->mMaterial)._M_dataplus._M_p + lVar19);
          meshMaterial._M_dataplus._M_p = (pointer)&meshMaterial.field_2;
          meshMaterial._M_string_length = 0;
          meshMaterial.field_2._M_local_buf[0] = '\0';
          cVar10 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::SemanticMappingTable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::SemanticMappingTable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::SemanticMappingTable>_>_>
                   ::find(&(__k->mMaterials)._M_t,(key_type *)pSubMesh);
          if ((_Rb_tree_header *)cVar10._M_node ==
              &(__k->mMaterials)._M_t._M_impl.super__Rb_tree_header) {
            pLVar11 = DefaultLogger::get();
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            basic_formatter<char[46]>
                      ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &index,(char (*) [46])"Collada: No material specified for subgroup <");
            std::operator<<((ostream *)&index,(string *)pSubMesh);
            std::operator<<((ostream *)&index,"> in geometry <");
            std::operator<<((ostream *)&index,(string *)__k);
            std::operator<<((ostream *)&index,">.");
            std::__cxx11::stringbuf::str();
            Logger::warn(pLVar11,(char *)dstMesh);
            std::__cxx11::string::~string((string *)&dstMesh);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&index);
            if ((__k->mMaterials)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
              std::__cxx11::string::_M_assign((string *)&meshMaterial);
            }
            table = (SemanticMappingTable *)0x0;
          }
          else {
            table = (SemanticMappingTable *)(cVar10._M_node + 2);
            std::__cxx11::string::_M_assign((string *)&meshMaterial);
          }
          this_00 = (ColladaLoader *)&this->mMaterialIndexByName;
          iVar12 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   ::find(&(this->mMaterialIndexByName)._M_t,&meshMaterial);
          if ((_Rb_tree_header *)iVar12._M_node ==
              &(this->mMaterialIndexByName)._M_t._M_impl.super__Rb_tree_header) {
            local_2ac = _S_red;
          }
          else {
            local_2ac = iVar12._M_node[2]._M_color;
          }
          if ((table != (SemanticMappingTable *)0x0) &&
             ((table->mMap)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
            ppVar18 = (this->newMats).
                      super__Vector_base<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ApplyVertexToEffectSemanticMapping
                      (this_00,&(ppVar18[local_2ac].first)->mTexDiffuse,table);
            ppVar18 = ppVar18 + local_2ac;
            ApplyVertexToEffectSemanticMapping(this_00,&ppVar18->first->mTexAmbient,table);
            ApplyVertexToEffectSemanticMapping(this_00,&ppVar18->first->mTexSpecular,table);
            ApplyVertexToEffectSemanticMapping(this_00,&ppVar18->first->mTexEmissive,table);
            ApplyVertexToEffectSemanticMapping(this_00,&ppVar18->first->mTexTransparent,table);
            ApplyVertexToEffectSemanticMapping(this_00,&ppVar18->first->mTexBump,table);
          }
          ColladaMeshIndex::ColladaMeshIndex
                    (&index,&__k->mMeshOrController,pSubMesh_00,&meshMaterial);
          iVar13 = std::
                   _Rb_tree<Assimp::ColladaMeshIndex,_std::pair<const_Assimp::ColladaMeshIndex,_unsigned_long>,_std::_Select1st<std::pair<const_Assimp::ColladaMeshIndex,_unsigned_long>_>,_std::less<Assimp::ColladaMeshIndex>,_std::allocator<std::pair<const_Assimp::ColladaMeshIndex,_unsigned_long>_>_>
                   ::find(&(this->mMeshIndexByID)._M_t,&index);
          if ((_Rb_tree_header *)iVar13._M_node ==
              &(this->mMeshIndexByID)._M_t._M_impl.super__Rb_tree_header) {
            dstMesh = CreateMesh(this,pParser,local_298,pSubMesh,local_258,local_250,local_2a0);
            local_1d0 = (long)(this->mMeshes).
                              super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)(this->mMeshes).
                              super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                              super__Vector_impl_data._M_start >> 3;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                      (&newMeshRefs,&local_1d0);
            ppaVar5 = (this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            ppaVar6 = (this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            pmVar14 = std::
                      map<Assimp::ColladaMeshIndex,_unsigned_long,_std::less<Assimp::ColladaMeshIndex>,_std::allocator<std::pair<const_Assimp::ColladaMeshIndex,_unsigned_long>_>_>
                      ::operator[](&this->mMeshIndexByID,&index);
            *pmVar14 = (long)ppaVar6 - (long)ppaVar5 >> 3;
            std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back(&this->mMeshes,&dstMesh);
            paVar8 = dstMesh;
            uVar2 = dstMesh->mNumVertices;
            local_2a0 = local_2a0 + pSubMesh->mNumFaces;
            dstMesh->mMaterialIndex = local_2ac;
            if (((dstMesh->mName).length == 0) &&
               (__n = (__k->mMeshOrController)._M_string_length, __n < 0x400)) {
              (dstMesh->mName).length = (ai_uint32)__n;
              memcpy((dstMesh->mName).data,(__k->mMeshOrController)._M_dataplus._M_p,__n);
              (paVar8->mName).data[__n] = '\0';
            }
            local_250 = local_250 + uVar2;
          }
          else {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      (&newMeshRefs,(value_type_conflict7 *)&iVar13._M_node[3]._M_parent);
          }
          ColladaMeshIndex::~ColladaMeshIndex(&index);
          std::__cxx11::string::~string((string *)&meshMaterial);
        }
        pSubMesh_00 = pSubMesh_00 + 1;
        lVar19 = lVar19 + 0x28;
      }
    }
    __k = __k + 1;
  } while( true );
}

Assistant:

void ColladaLoader::BuildMeshesForNode(const ColladaParser& pParser, const Collada::Node* pNode, aiNode* pTarget) {
    // accumulated mesh references by this node
    std::vector<size_t> newMeshRefs;
    newMeshRefs.reserve(pNode->mMeshes.size());

    // add a mesh for each subgroup in each collada mesh
    for (const Collada::MeshInstance& mid : pNode->mMeshes) {
        const Collada::Mesh* srcMesh = nullptr;
        const Collada::Controller* srcController = nullptr;

        // find the referred mesh
        ColladaParser::MeshLibrary::const_iterator srcMeshIt = pParser.mMeshLibrary.find(mid.mMeshOrController);
        if (srcMeshIt == pParser.mMeshLibrary.end()) {
            // if not found in the mesh-library, it might also be a controller referring to a mesh
            ColladaParser::ControllerLibrary::const_iterator srcContrIt = pParser.mControllerLibrary.find(mid.mMeshOrController);
            if (srcContrIt != pParser.mControllerLibrary.end()) {
                srcController = &srcContrIt->second;
                srcMeshIt = pParser.mMeshLibrary.find(srcController->mMeshId);
                if (srcMeshIt != pParser.mMeshLibrary.end()) {
                    srcMesh = srcMeshIt->second;
                }
            }


            if( nullptr == srcMesh) {
                ASSIMP_LOG_WARN_F( "Collada: Unable to find geometry for ID \"", mid.mMeshOrController, "\". Skipping." );
                continue;
            }
        }
        else {
            // ID found in the mesh library -> direct reference to an unskinned mesh
            srcMesh = srcMeshIt->second;
        }

        // build a mesh for each of its subgroups
        size_t vertexStart = 0, faceStart = 0;
        for (size_t sm = 0; sm < srcMesh->mSubMeshes.size(); ++sm) {
            const Collada::SubMesh& submesh = srcMesh->mSubMeshes[sm];
            if (submesh.mNumFaces == 0) {
                continue;
            }

            // find material assigned to this submesh
            std::string meshMaterial;
            std::map<std::string, Collada::SemanticMappingTable >::const_iterator meshMatIt = mid.mMaterials.find(submesh.mMaterial);

            const Collada::SemanticMappingTable* table = nullptr;
            if (meshMatIt != mid.mMaterials.end()) {
                table = &meshMatIt->second;
                meshMaterial = table->mMatName;
            }
            else {
                ASSIMP_LOG_WARN_F("Collada: No material specified for subgroup <", submesh.mMaterial, "> in geometry <",
                    mid.mMeshOrController, ">.");
                if (!mid.mMaterials.empty()) {
                    meshMaterial = mid.mMaterials.begin()->second.mMatName;
                }
            }

            // OK ... here the *real* fun starts ... we have the vertex-input-to-effect-semantic-table
            // given. The only mapping stuff which we do actually support is the UV channel.
            std::map<std::string, size_t>::const_iterator matIt = mMaterialIndexByName.find(meshMaterial);
            unsigned int matIdx = 0;
            if (matIt != mMaterialIndexByName.end()) {
                matIdx = static_cast<unsigned int>(matIt->second);
            }

            if (table && !table->mMap.empty()) {
                std::pair<Collada::Effect*, aiMaterial*>&  mat = newMats[matIdx];

                // Iterate through all texture channels assigned to the effect and
                // check whether we have mapping information for it.
                ApplyVertexToEffectSemanticMapping(mat.first->mTexDiffuse, *table);
                ApplyVertexToEffectSemanticMapping(mat.first->mTexAmbient, *table);
                ApplyVertexToEffectSemanticMapping(mat.first->mTexSpecular, *table);
                ApplyVertexToEffectSemanticMapping(mat.first->mTexEmissive, *table);
                ApplyVertexToEffectSemanticMapping(mat.first->mTexTransparent, *table);
                ApplyVertexToEffectSemanticMapping(mat.first->mTexBump, *table);
            }

            // built lookup index of the Mesh-Submesh-Material combination
            ColladaMeshIndex index(mid.mMeshOrController, sm, meshMaterial);

            // if we already have the mesh at the library, just add its index to the node's array
            std::map<ColladaMeshIndex, size_t>::const_iterator dstMeshIt = mMeshIndexByID.find(index);
            if (dstMeshIt != mMeshIndexByID.end()) {
                newMeshRefs.push_back(dstMeshIt->second);
            }
            else {
                // else we have to add the mesh to the collection and store its newly assigned index at the node
                aiMesh* dstMesh = CreateMesh(pParser, srcMesh, submesh, srcController, vertexStart, faceStart);

                // store the mesh, and store its new index in the node
                newMeshRefs.push_back(mMeshes.size());
                mMeshIndexByID[index] = mMeshes.size();
                mMeshes.push_back(dstMesh);
                vertexStart += dstMesh->mNumVertices; faceStart += submesh.mNumFaces;

                // assign the material index
                dstMesh->mMaterialIndex = matIdx;
                if (dstMesh->mName.length == 0) {
                    dstMesh->mName = mid.mMeshOrController;
                }
            }
        }
    }

    // now place all mesh references we gathered in the target node
    pTarget->mNumMeshes = static_cast<unsigned int>(newMeshRefs.size());
    if (newMeshRefs.size()) {
        struct UIntTypeConverter {
            unsigned int operator()(const size_t& v) const {
                return static_cast<unsigned int>(v);
            }
        };

        pTarget->mMeshes = new unsigned int[pTarget->mNumMeshes];
        std::transform(newMeshRefs.begin(), newMeshRefs.end(), pTarget->mMeshes, UIntTypeConverter());
    }
}